

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::GeometryHelper_MakeQL_RectParallelepiped
          (X3DImporter *this,aiVector3D *pSize,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  size_t *psVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _List_node_base *p_Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar5 = pSize->x * 0.5;
  fVar6 = -fVar5;
  uVar2 = pSize->y;
  uVar3 = pSize->z;
  fVar7 = (float)uVar2 * 0.5;
  fVar8 = (float)uVar3 * 0.5;
  fVar9 = -fVar7;
  fVar10 = -fVar8;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7) ^ 0x8000000080000000;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar7;
  *(float *)&p_Var4[1]._M_prev = fVar10;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7);
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar9;
  *(float *)&p_Var4[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar7;
  *(float *)&p_Var4[1]._M_prev = fVar10;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7) ^ 0x8000000080000000;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar9;
  *(float *)&p_Var4[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7);
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7) ^ 0x8000000080000000;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7) ^ 0x8000000080000000;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar9;
  *(float *)&p_Var4[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar9;
  *(float *)&p_Var4[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar7;
  *(float *)&p_Var4[1]._M_prev = fVar10;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar7;
  *(float *)&p_Var4[1]._M_prev = fVar10;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7);
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7);
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar9;
  *(float *)&p_Var4[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7);
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7);
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar9;
  *(float *)&p_Var4[1]._M_prev = fVar8;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7) ^ 0x8000000080000000;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar6;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar7;
  *(float *)&p_Var4[1]._M_prev = fVar10;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(float *)((long)&p_Var4[1]._M_next + 4) = fVar7;
  *(float *)&p_Var4[1]._M_prev = fVar10;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var4 = (_List_node_base *)operator_new(0x20);
  *(float *)&p_Var4[1]._M_next = fVar5;
  *(ulong *)((long)&p_Var4[1]._M_next + 4) = CONCAT44(fVar8,fVar7) ^ 0x8000000080000000;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void X3DImporter::GeometryHelper_MakeQL_RectParallelepiped(const aiVector3D& pSize, std::list<aiVector3D>& pVertices)
{
	MESH_RectParallelepiped_CREATE_VERT;
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 3, 2, 1, 0);// front
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 6, 7, 4, 5);// back
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 7, 3, 0, 4);// left
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 2, 6, 5, 1);// right
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 0, 1, 5, 4);// top
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 7, 6, 2, 3);// bottom
}